

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

ssize_t uv__recvmsg(int fd,msghdr *msg,int flags)

{
  size_t sVar1;
  ssize_t sVar2;
  int *piVar3;
  cmsghdr *__cmsg;
  cmsghdr *pcVar4;
  long lVar5;
  
  if (uv__recvmsg_no_msg_cmsg_cloexec == '\0') {
    sVar2 = recvmsg(fd,(msghdr *)msg,flags | 0x40000000);
    if (sVar2 != -1) {
      return sVar2;
    }
    piVar3 = __errno_location();
    lVar5 = (long)*piVar3;
    if (lVar5 == 0x16) {
      sVar2 = recvmsg(fd,(msghdr *)msg,flags);
      if (sVar2 != -1) {
        uv__recvmsg_no_msg_cmsg_cloexec = '\x01';
        goto LAB_0010be8c;
      }
      lVar5 = (long)*piVar3;
    }
  }
  else {
    sVar2 = recvmsg(fd,(msghdr *)msg,flags);
    if (sVar2 != -1) {
LAB_0010be8c:
      if (msg->msg_controllen == 0) {
        return sVar2;
      }
      if (msg->msg_controllen < 0x10) {
        __cmsg = (cmsghdr *)0x0;
      }
      else {
        __cmsg = (cmsghdr *)msg->msg_control;
      }
      for (; __cmsg != (cmsghdr *)0x0; __cmsg = __cmsg_nxthdr((msghdr *)msg,__cmsg)) {
        if (__cmsg->cmsg_type == 1) {
          sVar1 = __cmsg->cmsg_len;
          for (pcVar4 = __cmsg + 1; pcVar4 < (cmsghdr *)((long)&__cmsg->cmsg_len + sVar1);
              pcVar4 = (cmsghdr *)((long)&pcVar4->cmsg_len + 4)) {
            uv__cloexec_ioctl((int)pcVar4->cmsg_len,1);
          }
        }
      }
      return sVar2;
    }
    piVar3 = __errno_location();
    lVar5 = (long)*piVar3;
  }
  return -lVar5;
}

Assistant:

ssize_t uv__recvmsg(int fd, struct msghdr* msg, int flags) {
  struct cmsghdr* cmsg;
  ssize_t rc;
  int* pfd;
  int* end;
#if defined(__linux__)
  static int no_msg_cmsg_cloexec;
  if (no_msg_cmsg_cloexec == 0) {
    rc = recvmsg(fd, msg, flags | 0x40000000);  /* MSG_CMSG_CLOEXEC */
    if (rc != -1)
      return rc;
    if (errno != EINVAL)
      return UV__ERR(errno);
    rc = recvmsg(fd, msg, flags);
    if (rc == -1)
      return UV__ERR(errno);
    no_msg_cmsg_cloexec = 1;
  } else {
    rc = recvmsg(fd, msg, flags);
  }
#else
  rc = recvmsg(fd, msg, flags);
#endif
  if (rc == -1)
    return UV__ERR(errno);
  if (msg->msg_controllen == 0)
    return rc;
  for (cmsg = CMSG_FIRSTHDR(msg); cmsg != NULL; cmsg = CMSG_NXTHDR(msg, cmsg))
    if (cmsg->cmsg_type == SCM_RIGHTS)
      for (pfd = (int*) CMSG_DATA(cmsg),
           end = (int*) ((char*) cmsg + cmsg->cmsg_len);
           pfd < end;
           pfd += 1)
        uv__cloexec(*pfd, 1);
  return rc;
}